

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

handle pybind11::detail::
       set_caster<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>,unsigned_int>
       ::
       cast<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>&>
                 (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *src,return_value_policy policy,handle parent)

{
  bool bVar1;
  type h;
  undefined8 in_RDI;
  object value_;
  uint *value;
  iterator __end0;
  iterator __begin0;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range3;
  set s;
  handle in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  set *in_stack_ffffffffffffff90;
  handle local_50;
  reference local_48;
  _Node_iterator_base<unsigned_int,_false> local_40;
  _Node_iterator_base<unsigned_int,_false> local_38;
  undefined8 local_30;
  undefined8 local_18;
  handle local_8;
  
  local_18 = in_RDI;
  set::set(in_stack_ffffffffffffff90);
  local_30 = local_18;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)in_stack_ffffffffffffff68.m_ptr);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)in_stack_ffffffffffffff68.m_ptr);
  while (bVar1 = std::__detail::operator!=(&local_38,&local_40), bVar1) {
    local_48 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*
                         ((_Node_iterator<unsigned_int,_true,_false> *)0x416775);
    forward_like<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>&,unsigned_int_const&>
              (local_48);
    h = type_caster<unsigned_int,_void>::cast<unsigned_int>(0,automatic,in_stack_ffffffffffffff68);
    reinterpret_steal<pybind11::object>((handle)h.m_ptr);
    bVar1 = pybind11::handle::operator_cast_to_bool(&local_50);
    if ((bVar1) &&
       (in_stack_ffffffffffffff77 =
             set::add<pybind11::object&>
                       ((set *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                        (object *)in_stack_ffffffffffffff68.m_ptr), (bool)in_stack_ffffffffffffff77)
       ) {
      bVar1 = false;
    }
    else {
      memset(&local_8,0,8);
      pybind11::handle::handle(&local_8);
      bVar1 = true;
    }
    object::~object((object *)0x416869);
    if (bVar1) goto LAB_004168a8;
    std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++
              ((_Node_iterator<unsigned_int,_true,_false> *)
               CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  }
  local_8 = object::release(in_stack_ffffffffffffff68.m_ptr);
LAB_004168a8:
  set::~set((set *)0x4168b2);
  return (handle)local_8.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Key>::policy(policy);
        pybind11::set s;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(key_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_ || !s.add(value_))
                return handle();
        }
        return s.release();
    }